

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::FlushChunkExponents(idx2_file *Idx2,encode_data *E)

{
  int iVar1;
  array<idx2::sub_channel_info> *Array;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  ulong uVar8;
  sub_channel_info *Beg;
  allocator *paVar9;
  undefined1 auVar10 [16];
  ulong *puVar11;
  FILE *__s;
  size_t sVar12;
  u64 *puVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  i8 in_R9B;
  sub_channel *psVar17;
  chunk_exp_info *pcVar18;
  long lVar19;
  byte *pbVar20;
  long lVar21;
  int iVar22;
  byte *pbVar23;
  long *in_FS_OFFSET;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined1 in_ZMM2 [64];
  undefined8 in_XMM4_Qb;
  stref sVar28;
  file_id FileId;
  anon_union_8_2_2df48d06_for_stref_0 local_98;
  long local_90;
  allocator *local_88;
  encode_data *local_80;
  idx2_file *local_78;
  bitstream *local_70;
  array<unsigned_char> *local_68;
  size_t local_60;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  undefined4 local_50;
  anon_union_8_2_2df48d06_for_stref_0 local_48 [3];
  
  Array = &E->SortedSubChannels;
  GrowCapacity<idx2::sub_channel_info>(Array,(E->SubChannels).Size);
  (E->SortedSubChannels).Size = 0;
  lVar16 = (E->SubChannels).LogCapacity;
  lVar19 = 1L << ((byte)lVar16 & 0x3f);
  lVar21 = lVar19;
  if (lVar16 != 0x3f) {
    lVar15 = 0;
    lVar16 = 0;
    if (0 < lVar19) {
      lVar16 = lVar19;
    }
    do {
      lVar21 = lVar15;
      if ((E->SubChannels).Stats[lVar15] == Occupied) break;
      lVar15 = lVar15 + 1;
      lVar21 = lVar19;
    } while (lVar16 + 1 != lVar15);
  }
  if (lVar21 != 1L << ((byte)(E->SubChannels).LogCapacity & 0x3f)) {
    psVar17 = (E->SubChannels).Vals + lVar21;
    puVar11 = (E->SubChannels).Keys + lVar21;
    do {
      uVar8 = *puVar11;
      if ((E->SortedSubChannels).Capacity <= (E->SortedSubChannels).Size) {
        GrowCapacity<idx2::sub_channel_info>(Array,0);
      }
      pbVar20 = (E->SortedSubChannels).Buffer.Data;
      lVar16 = (E->SortedSubChannels).Size;
      (E->SortedSubChannels).Size = lVar16 + 1;
      lVar16 = lVar16 * 0x10;
      pbVar20[lVar16] = (byte)(uVar8 >> 0x3c);
      pbVar20[lVar16 + 1] = (byte)(uVar8 >> 0xc) & 0x3f;
      *(sub_channel **)(pbVar20 + lVar16 + 8) = psVar17;
      lVar16 = lVar21 * -0x70;
      lVar19 = lVar21 * -8;
      do {
        lVar16 = lVar16 + -0x70;
        lVar19 = lVar19 + -8;
        lVar15 = lVar21 + 1;
        lVar21 = lVar21 + 1;
      } while ((E->SubChannels).Stats[lVar15] != Occupied);
      puVar11 = (ulong *)((long)(E->SubChannels).Keys - lVar19);
      psVar17 = (sub_channel *)((long)(E->SubChannels).Vals - lVar16);
    } while (1L << ((byte)(E->SubChannels).LogCapacity & 0x3f) != lVar21);
  }
  Beg = (sub_channel_info *)(E->SortedSubChannels).Buffer.Data;
  InsertionSort<idx2::sub_channel_info*>(Beg,Beg + (E->SortedSubChannels).Size);
  if ((E->SortedSubChannels).Size != 0) {
    pbVar20 = (Array->Buffer).Data;
    do {
      WriteChunkExponents((idx2 *)Idx2,(idx2_file *)E,*(encode_data **)(pbVar20 + 8),
                          (sub_channel *)(ulong)(uint)(int)(char)*pbVar20,pbVar20[1],in_R9B);
      pbVar20 = pbVar20 + 0x10;
    } while (pbVar20 != (E->SortedSubChannels).Buffer.Data + (E->SortedSubChannels).Size * 0x10);
  }
  lVar16 = (E->ChunkExponents).LogCapacity;
  lVar19 = 1L << ((byte)lVar16 & 0x3f);
  lVar21 = lVar19;
  if (lVar16 != 0x3f) {
    lVar15 = 0;
    lVar16 = 0;
    if (0 < lVar19) {
      lVar16 = lVar19;
    }
    do {
      lVar21 = lVar15;
      if ((E->ChunkExponents).Stats[lVar15] == Occupied) break;
      lVar15 = lVar15 + 1;
      lVar21 = lVar19;
    } while (lVar16 + 1 != lVar15);
  }
  if (lVar21 != 1L << ((byte)(E->ChunkExponents).LogCapacity & 0x3f)) {
    pcVar18 = (E->ChunkExponents).Vals + lVar21;
    puVar13 = (E->ChunkExponents).Keys + lVar21;
    local_70 = &E->CompressedChunkAddresses;
    local_80 = E;
    local_78 = Idx2;
    do {
      uVar27 = in_ZMM2._8_8_;
      ConstructFilePath((file_id *)local_48,Idx2,*puVar13);
      __s = fopen(local_48[0].Ptr,"ab");
      if (__s == (FILE *)0x0) {
        local_58.Ptr = local_48[0].Ptr;
        sVar12 = strlen(local_48[0].Ptr);
        local_50 = (undefined4)sVar12;
        sVar28 = GetParentPath((stref *)&local_58);
        local_98 = sVar28.field_0;
        local_90 = CONCAT44(local_90._4_4_,sVar28.Size);
        CreateFullDir((stref *)&local_98);
        __s = fopen(local_48[0].Ptr,"ab");
      }
      puVar13 = (u64 *)(pcVar18->ExpSizes).BitPtr;
      *puVar13 = (pcVar18->ExpSizes).BitBuf;
      uVar7 = (pcVar18->ExpSizes).BitPos;
      if (0 < (int)uVar7 >> 3) {
        (pcVar18->ExpSizes).BitBuf =
             ((pcVar18->ExpSizes).BitBuf >> 1) >> (((byte)uVar7 & 0xf8) - 1 & 0x3f);
      }
      pbVar20 = (byte *)((long)puVar13 + (long)((int)uVar7 >> 3));
      (pcVar18->ExpSizes).BitPtr = pbVar20;
      (pcVar18->ExpSizes).BitPos = uVar7 & 7;
      auVar24._0_8_ =
           (double)(long)(pbVar20 +
                         ((ulong)((uVar7 & 7) + 7 >> 3) - (long)(pcVar18->ExpSizes).Stream.Data));
      auVar24._8_8_ = uVar27;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = _ZN4idx2L17ExpChunkSizesStatE_0;
      auVar10 = vminsd_avx(auVar24,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = _ZN4idx2L17ExpChunkSizesStatE_1;
      auVar2 = vmaxsd_avx(auVar24,auVar3);
      in_ZMM2 = ZEXT1664(auVar2);
      _ZN4idx2L17ExpChunkSizesStatE_2 = auVar24._0_8_ + _ZN4idx2L17ExpChunkSizesStatE_2;
      _ZN4idx2L17ExpChunkSizesStatE_0 = auVar10._0_8_;
      _ZN4idx2L17ExpChunkSizesStatE_3 = _ZN4idx2L17ExpChunkSizesStatE_3 + 1;
      _ZN4idx2L17ExpChunkSizesStatE_1 = auVar2._0_8_;
      _ZN4idx2L17ExpChunkSizesStatE_4 =
           auVar24._0_8_ * auVar24._0_8_ + _ZN4idx2L17ExpChunkSizesStatE_4;
      local_60 = (pcVar18->FileExpBuffer).Size;
      fwrite((pcVar18->FileExpBuffer).Buffer.Data,local_60,1,__s);
      pbVar20 = (pcVar18->ExpSizes).Stream.Data;
      iVar14 = (pcVar18->ExpSizes).BitPos;
      iVar1 = iVar14 + 7;
      iVar14 = iVar14 + 0xe;
      if (-1 < iVar1) {
        iVar14 = iVar1;
      }
      pbVar23 = (pcVar18->ExpSizes).BitPtr + ((long)(iVar14 >> 3) - (long)pbVar20);
      fwrite(pbVar20,(size_t)pbVar23,1,__s);
      iVar22 = (int)pbVar23;
      local_98._0_4_ = iVar22;
      fwrite(&local_98,4,1,__s);
      local_90 = (pcVar18->Addrs).Size << 3;
      auVar25._0_8_ = (double)local_90;
      auVar25._8_8_ = in_XMM4_Qb;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = _ZN4idx2L33UncompressedExpChunkAddressesStatE_0;
      auVar2 = vminsd_avx(auVar25,auVar10);
      _ZN4idx2L33UncompressedExpChunkAddressesStatE_0 = auVar2._0_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = _ZN4idx2L33UncompressedExpChunkAddressesStatE_1;
      auVar2 = vmaxsd_avx(auVar25,auVar4);
      _ZN4idx2L33UncompressedExpChunkAddressesStatE_1 = auVar2._0_8_;
      _ZN4idx2L33UncompressedExpChunkAddressesStatE_2 =
           auVar25._0_8_ + _ZN4idx2L33UncompressedExpChunkAddressesStatE_2;
      _ZN4idx2L33UncompressedExpChunkAddressesStatE_3 =
           _ZN4idx2L33UncompressedExpChunkAddressesStatE_3 + 1;
      _ZN4idx2L33UncompressedExpChunkAddressesStatE_4 =
           auVar25._0_8_ * auVar25._0_8_ + _ZN4idx2L33UncompressedExpChunkAddressesStatE_4;
      local_98 = (anon_union_8_2_2df48d06_for_stref_0)(pcVar18->Addrs).Buffer.Data;
      local_88 = (pcVar18->Addrs).Buffer.Alloc;
      CompressBufZstd((buffer *)&local_98,local_70);
      pbVar20 = (local_80->CompressedChunkAddresses).Stream.Data;
      iVar14 = (local_80->CompressedChunkAddresses).BitPos;
      iVar1 = iVar14 + 7;
      iVar14 = iVar14 + 0xe;
      if (-1 < iVar1) {
        iVar14 = iVar1;
      }
      pbVar23 = (local_80->CompressedChunkAddresses).BitPtr + ((long)(iVar14 >> 3) - (long)pbVar20);
      auVar26._0_8_ = (double)(long)pbVar23;
      auVar26._8_8_ = in_XMM4_Qb;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = _ZN4idx2L31CompressedExpChunkAddressesStatE_0;
      auVar2 = vminsd_avx(auVar26,auVar5);
      _ZN4idx2L31CompressedExpChunkAddressesStatE_0 = auVar2._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = _ZN4idx2L31CompressedExpChunkAddressesStatE_1;
      auVar2 = vmaxsd_avx(auVar26,auVar6);
      local_68 = &pcVar18->FileExpBuffer;
      _ZN4idx2L31CompressedExpChunkAddressesStatE_1 = auVar2._0_8_;
      _ZN4idx2L31CompressedExpChunkAddressesStatE_2 =
           auVar26._0_8_ + _ZN4idx2L31CompressedExpChunkAddressesStatE_2;
      _ZN4idx2L31CompressedExpChunkAddressesStatE_3 =
           _ZN4idx2L31CompressedExpChunkAddressesStatE_3 + 1;
      _ZN4idx2L31CompressedExpChunkAddressesStatE_4 =
           auVar26._0_8_ * auVar26._0_8_ + _ZN4idx2L31CompressedExpChunkAddressesStatE_4;
      fwrite(pbVar20,(size_t)pbVar23,1,__s);
      local_98._0_4_ = (int)pbVar23;
      fwrite(&local_98,4,1,__s);
      local_98._0_4_ = (undefined4)(pcVar18->Addrs).Size;
      fwrite(&local_98,4,1,__s);
      local_98._0_4_ = iVar22 + (int)local_60 + (int)pbVar23 + 0x10;
      fwrite(&local_98,4,1,__s);
      paVar9 = (pcVar18->FileExpBuffer).Alloc;
      (*paVar9->_vptr_allocator[1])(paVar9,local_68);
      Idx2 = local_78;
      (pcVar18->FileExpBuffer).Size = 0;
      (pcVar18->FileExpBuffer).Capacity = 0;
      if (__s != (FILE *)0x0) {
        fclose(__s);
      }
      lVar16 = lVar21 * -0x90;
      lVar19 = lVar21 * -8;
      do {
        lVar16 = lVar16 + -0x90;
        lVar19 = lVar19 + -8;
        lVar15 = lVar21 + 1;
        lVar21 = lVar21 + 1;
      } while ((local_80->ChunkExponents).Stats[lVar15] != Occupied);
      puVar13 = (u64 *)((long)(local_80->ChunkExponents).Keys - lVar19);
      pcVar18 = (chunk_exp_info *)((long)(local_80->ChunkExponents).Vals - lVar16);
    } while (1L << ((byte)(local_80->ChunkExponents).LogCapacity & 0x3f) != lVar21);
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xcb;
  return (error<idx2::idx2_err_code>)ZEXT816(0x1bd71d);
}

Assistant:

error<idx2_err_code>
FlushChunkExponents(const idx2_file& Idx2, encode_data* E)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    Reserve(&E->SortedSubChannels, Size(E->SubChannels));
    Clear(&E->SortedSubChannels);
    idx2_ForEach (Sch, E->SubChannels)
    {
      sub_channel_info ScInfo;
      ScInfo.SubChannel = &*Sch;
      u64 Brick;
      i16 BitPlane;
      UnpackFileAddress(Idx2, *Sch.Key, &Brick, &ScInfo.Level, &ScInfo.Subband, &BitPlane);
      PushBack(&E->SortedSubChannels, ScInfo);
    }
    InsertionSort(Begin(E->SortedSubChannels), End(E->SortedSubChannels));

    idx2_ForEach (Sch, E->SortedSubChannels)
      WriteChunkExponents(Idx2, E, Sch->SubChannel, Sch->Level, Sch->Subband); //just call  WriteChunkExponents

    return idx2_Error(idx2_err_code::NoError);
  }
#endif

  Reserve(&E->SortedSubChannels, Size(E->SubChannels));
  Clear(&E->SortedSubChannels);
  idx2_ForEach (Sch, E->SubChannels)
  {
    sub_channel_info ScInfo;
    ScInfo.SubChannel = &*Sch;
    u64 Brick;
    i16 BitPlane;
    UnpackFileAddress(Idx2, *Sch.Key, &Brick, &ScInfo.Level, &ScInfo.Subband, &BitPlane);
    PushBack(&E->SortedSubChannels, ScInfo);
  }
  InsertionSort(Begin(E->SortedSubChannels), End(E->SortedSubChannels));

  idx2_ForEach (Sch, E->SortedSubChannels)
    WriteChunkExponents(Idx2, E, Sch->SubChannel, Sch->Level, Sch->Subband);
  // TODO: deallocate the file emax buffer after it is flushed to a file
  // TODO: need to "interleave" this with FlushChunk
  // TODO: detect that we are done with a file to flush it as soon as possible instead of at the end (maybe count the number of chunks in a file)
  // TODO: as soon as we get out of a spatial domain for a file, flush every files in the buffer
  // (since we know that all files in the buffer cannot be traversed again in the spatial DFS order)
  idx2_ForEach (CeIt, E->ChunkExponents) // one CeIt for each file
  {
    chunk_exp_info* Ce = CeIt.Val;
    bitstream* ChunkExpSizes = &Ce->ExpSizes;
    file_id FileId = ConstructFilePath(Idx2, *CeIt.Key);
    idx2_Assert(FileId.Id == *CeIt.Key);
    /* write chunk emax sizes */
    idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
    Flush(ChunkExpSizes);
    ExpChunkSizesStat.Add((f64)Size(*ChunkExpSizes));
    int TotalExpBytes = 0;
    // write the exponent buffer
    buffer Buf = ToBuffer(Ce->FileExpBuffer);
    WriteBuffer(Fp, Buf);
    TotalExpBytes += int(Buf.Bytes);
    // write the (compressed) sizes of the exponents
    Buf = ToBuffer(*ChunkExpSizes);
    WriteBuffer(Fp, Buf);
    WritePOD(Fp, (int)Buf.Bytes);
    TotalExpBytes += int(Buf.Bytes) + sizeof(int);
    // write compressed chunk addresses
    UncompressedExpChunkAddressesStat.Add((f64)Size(ToBuffer(Ce->Addrs)));
    CompressBufZstd(ToBuffer(Ce->Addrs), &E->CompressedChunkAddresses);
    CompressedExpChunkAddressesStat.Add((f64)Size(E->CompressedChunkAddresses));
    Buf = ToBuffer(E->CompressedChunkAddresses);
    WriteBuffer(Fp, Buf);
    WritePOD(Fp, (int)Buf.Bytes);
    TotalExpBytes += int(Buf.Bytes) + sizeof(int);
    // write number of chunks
    WritePOD(Fp, (int)Size(Ce->Addrs));
    TotalExpBytes += sizeof(int);
    // write the total number of bytes used for storing the exponents
    TotalExpBytes += sizeof(int);
    WritePOD(Fp, (int)TotalExpBytes);
    Dealloc(&CeIt.Val->FileExpBuffer);
  }

  return idx2_Error(idx2_err_code::NoError);
}